

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O3

double __thiscall
KMaxDistance::compute
          (KMaxDistance *this,double *xEdgeCosts,double *yEdgeCosts,int width,int height,
          int numDistMaxs,int *srcPixs,int numSrcPixs,int dstPix,double *dists,int *backPtrs,
          double *maxVector)

{
  double *pdVar1;
  size_t __size;
  double dVar2;
  int iVar3;
  MaxRec *pMVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  ulong uVar12;
  uint uVar13;
  MaxRec **maxs;
  MaxRec *pMVar14;
  NodeAVL *pNVar15;
  undefined4 in_register_0000000c;
  void *pvVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  ulong uVar22;
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  double dVar27;
  NodeAVL *local_90;
  int local_84;
  KMaxDistance *local_80;
  int local_74;
  undefined8 local_70;
  void *local_68;
  ulong local_60;
  double *local_58;
  int local_4c;
  double *local_48;
  double *local_40;
  long local_38;
  
  local_70 = CONCAT44(in_register_0000000c,width);
  local_80 = this;
  local_74 = height;
  local_48 = xEdgeCosts;
  local_40 = yEdgeCosts;
  if (numDistMaxs < 0x29) {
    if (numDistMaxs < 1) {
      compute();
    }
    else {
      if (0 < numSrcPixs) {
        this->numMaxRecs = 0;
        this->numMaxRecsInOneNode = 0;
        this->numDistMaxsGl = numDistMaxs;
        uVar13 = height * width;
        local_60 = (ulong)uVar13;
        lVar19 = (long)(int)uVar13;
        __size = lVar19 * 8;
        local_84 = numDistMaxs;
        if (dists == (double *)0x0) {
          dists = (double *)malloc(__size);
        }
        maxs = (MaxRec **)malloc(__size);
        local_68 = malloc(lVar19 << 6);
        if (0 < (int)uVar13) {
          uVar22 = 0;
          memset(maxs,0,__size);
          auVar23 = vbroadcastsd_avx512f(ZEXT816(0x4197d78400000000));
          auVar24 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar25 = vpbroadcastq_avx512f();
          do {
            auVar26 = vpbroadcastq_avx512f();
            auVar26 = vporq_avx512f(auVar26,auVar24);
            uVar12 = vpcmpuq_avx512f(auVar26,auVar25,2);
            pdVar1 = dists + uVar22;
            bVar5 = (bool)((byte)uVar12 & 1);
            bVar6 = (bool)((byte)(uVar12 >> 1) & 1);
            bVar7 = (bool)((byte)(uVar12 >> 2) & 1);
            bVar8 = (bool)((byte)(uVar12 >> 3) & 1);
            bVar9 = (bool)((byte)(uVar12 >> 4) & 1);
            bVar10 = (bool)((byte)(uVar12 >> 5) & 1);
            bVar11 = (bool)((byte)(uVar12 >> 6) & 1);
            *pdVar1 = (double)((ulong)bVar5 * auVar23._0_8_ | (ulong)!bVar5 * (long)*pdVar1);
            pdVar1[1] = (double)((ulong)bVar6 * auVar23._8_8_ | (ulong)!bVar6 * (long)pdVar1[1]);
            pdVar1[2] = (double)((ulong)bVar7 * auVar23._16_8_ | (ulong)!bVar7 * (long)pdVar1[2]);
            pdVar1[3] = (double)((ulong)bVar8 * auVar23._24_8_ | (ulong)!bVar8 * (long)pdVar1[3]);
            pdVar1[4] = (double)((ulong)bVar9 * auVar23._32_8_ | (ulong)!bVar9 * (long)pdVar1[4]);
            pdVar1[5] = (double)((ulong)bVar10 * auVar23._40_8_ | (ulong)!bVar10 * (long)pdVar1[5]);
            pdVar1[6] = (double)((ulong)bVar11 * auVar23._48_8_ | (ulong)!bVar11 * (long)pdVar1[6]);
            pdVar1[7] = (double)((uVar12 >> 7) * auVar23._56_8_ |
                                (ulong)!SUB81(uVar12 >> 7,0) * (long)pdVar1[7]);
            uVar22 = uVar22 + 8;
          } while (((int)local_60 + 7U & 0xfffffff8) != uVar22);
        }
        uVar22 = 0;
        local_90 = (NodeAVL *)0x0;
        local_58 = dists;
        local_38 = lVar19;
        do {
          iVar17 = srcPixs[uVar22];
          pMVar14 = createNewMaxRec(local_80,iVar17,local_84);
          pMVar14->wasMin = 1;
          pNVar15 = avlInsert(&local_90,0.0,pMVar14);
          pMVar14->qPtr = pNVar15;
          maxs[iVar17] = pMVar14;
          if (local_68 != (void *)0x0) {
            auVar23 = vmovdqu64_avx512f((undefined1  [64])*pMVar14);
            auVar23 = vmovdqu64_avx512f(auVar23);
            *(undefined1 (*) [64])((long)local_68 + (long)iVar17 * 0x40) = auVar23;
          }
          uVar22 = uVar22 + 1;
        } while ((uint)numSrcPixs != uVar22);
        pvVar16 = local_68;
        if (local_90 != (NodeAVL *)0x0) {
          local_74 = local_74 + -1;
          iVar17 = 0;
          local_4c = (int)local_70 + -1;
          do {
            pMVar14 = (MaxRec *)avlFindAndDeleteMin(&local_90);
            if (pMVar14->isUsed != 0) {
              pMVar14->wasMin = 1;
              iVar3 = pMVar14->imgIdx;
              lVar19 = (long)iVar3;
              dVar27 = local_58[lVar19];
              if (pMVar14->sumVals < dVar27) {
                local_58[lVar19] = pMVar14->sumVals;
                iVar17 = iVar17 + (uint)(99999999.99999999 < dVar27);
                *(MaxRec *)((long)pvVar16 + lVar19 * 0x40) = *pMVar14;
                if (iVar17 == (int)local_60) break;
              }
              if ((-1 < dstPix) && (local_58[(uint)dstPix] < 100000000.0)) break;
              iVar21 = iVar3 / (int)local_70;
              iVar18 = iVar3 % (int)local_70;
              if (0 < iVar18) {
                addPathToNodeAVL(local_80,pMVar14,iVar3 + -1,local_48[lVar19 + -1],local_84,maxs,
                                 &local_90);
              }
              if (iVar18 < local_4c) {
                addPathToNodeAVL(local_80,pMVar14,iVar3 + 1,local_48[lVar19],local_84,maxs,&local_90
                                );
              }
              pvVar16 = local_68;
              if (0 < iVar21) {
                addPathToNodeAVL(local_80,pMVar14,iVar3 - (int)local_70,
                                 local_40[iVar3 - (int)local_70],local_84,maxs,&local_90);
              }
              if (iVar21 < local_74) {
                addPathToNodeAVL(local_80,pMVar14,iVar3 + (int)local_70,local_40[lVar19],local_84,
                                 maxs,&local_90);
              }
            }
          } while (local_90 != (NodeAVL *)0x0);
        }
        lVar19 = local_38;
        uVar13 = -dstPix;
        if (0 < dstPix) {
          uVar13 = dstPix;
        }
        uVar22 = (ulong)uVar13;
        local_80 = (KMaxDistance *)local_58[uVar22];
        if (maxVector != (double *)0x0) {
          pMVar14 = maxs[uVar22];
          dVar27 = pMVar14->sumVals;
          iVar17 = pMVar14->numVals;
          if (0 < (long)iVar17) {
            lVar20 = 0;
            do {
              maxVector[lVar20] = pMVar14->vals[lVar20];
              lVar20 = lVar20 + 1;
            } while (iVar17 != lVar20);
          }
          while (pMVar14 = (MaxRec *)pMVar14->next, pMVar14 != (MaxRec *)0x0) {
            dVar2 = pMVar14->sumVals;
            if ((dVar2 < dVar27) && (iVar17 = pMVar14->numVals, dVar27 = dVar2, 0 < (long)iVar17)) {
              lVar20 = 0;
              do {
                maxVector[lVar20] = pMVar14->vals[lVar20];
                lVar20 = lVar20 + 1;
              } while (iVar17 != lVar20);
            }
          }
        }
        if (backPtrs != (int *)0x0) {
          if (pvVar16 == (void *)0x0) {
            uVar22 = 0;
          }
          else {
            pvVar16 = (void *)((long)pvVar16 + uVar22 * 0x40);
            uVar22 = 0;
            do {
              backPtrs[uVar22] = *(int *)((long)pvVar16 + 0x20);
              uVar22 = uVar22 + 1;
              pvVar16 = *(void **)((long)pvVar16 + 8);
            } while (pvVar16 != (void *)0x0);
            uVar22 = uVar22 & 0xffffffff;
          }
          backPtrs[uVar22] = -1;
        }
        if (local_90 != (NodeAVL *)0x0) {
          do {
            avlFindAndDeleteMin(&local_90);
          } while (local_90 != (NodeAVL *)0x0);
        }
        if ((int)local_60 < 1) {
          pNVar15 = (NodeAVL *)0x0;
        }
        else {
          lVar20 = 0;
          do {
            pMVar14 = maxs[lVar20];
            pNVar15 = local_90;
            while (local_90 = pNVar15, pMVar14 != (MaxRec *)0x0) {
              pMVar4 = (MaxRec *)pMVar14->next;
              free(pMVar14);
              pMVar14 = pMVar4;
              pNVar15 = local_90;
            }
            lVar20 = lVar20 + 1;
          } while (lVar20 != lVar19);
        }
        free(maxs);
        free(pNVar15);
        free(local_68);
        return (double)local_80;
      }
      compute();
    }
  }
  else {
    compute();
  }
  return 0.0;
}

Assistant:

double KMaxDistance::compute( const double *xEdgeCosts, const double *yEdgeCosts, const int width, const int height, const int numDistMaxs,
    const int *srcPixs, const int numSrcPixs, const int dstPix, double *dists, int* backPtrs, double *maxVector ){

    if ( numDistMaxs > MAX_NUM_MAXS ){ fprintf(stderr, "ERROR: numDistMaxs is too big (increase MAX_NUM_MAXS).\n" ); return 0.0; }
    if ( numDistMaxs < 1 ){ fprintf(stderr, "ERROR: numDistMaxs has to be positive.\n" ); return 0.0; }
    if ( numSrcPixs < 1 ){ fprintf(stderr, "ERROR: no source points found.\n" ); return 0.0; }

    numMaxRecs = 0;
    numMaxRecsInOneNode = 0;
    numDistMaxsGl = numDistMaxs;

	int cnt = 0;
    //double *dists;
    if ( dists == NULL ) dists = (double*)malloc( width*height*sizeof( dists[0] )); // else dists = distsExt; 
    MaxRec **maxs = (MaxRec**)malloc( width*height*sizeof( maxs[0] ));
    MaxRec* prevPtrs = (MaxRec*)malloc( width*height*sizeof( prevPtrs[0] ));
    
    for ( int i = 0; i < width*height; ++i ) 
    {
		maxs[i] = NULL;
		dists[i] = MAX_GEO_DIST;
	}

    NodeAVL *queue = NULL;

    for ( int i = 0; i < numSrcPixs; ++i ){
        int imgIdx = srcPixs[i];
        MaxRec *rec = createNewMaxRec( imgIdx, numDistMaxs );
        rec->wasMin = 1;
        rec->qPtr = avlInsert( &queue, 0.0, rec );
        maxs[imgIdx] = rec;
        if ( prevPtrs != NULL ) prevPtrs[imgIdx] = *rec;
    }

	
    while ( queue != NULL )
    {

        MaxRec *minDistRec = (MaxRec*)avlFindAndDeleteMin( &queue );

        if ( !minDistRec->isUsed ) continue;
        
        minDistRec->wasMin = 1;
        int imgIdx = minDistRec->imgIdx;
        
        if ( minDistRec->sumVals < dists[imgIdx] ){ 
            if ( dists[imgIdx] > MAX_GEO_DIST - GEO_MAX_EPSX ) cnt++;
            dists[imgIdx] = minDistRec->sumVals;
            prevPtrs[imgIdx] = *minDistRec;
            if ( cnt == width*height ) break;
        }
        
        if ( dstPix >= 0 ){ if ( dists[dstPix] < MAX_GEO_DIST ) break; }
        
        int y = imgIdx/width, x = imgIdx - y*width;
        if ( x > 0 )        addPathToNodeAVL( minDistRec,     imgIdx-1,     xEdgeCosts[imgIdx-1], numDistMaxs, maxs, &queue );
        if ( x < width-1 )  addPathToNodeAVL( minDistRec,     imgIdx+1,       xEdgeCosts[imgIdx], numDistMaxs, maxs, &queue );
        if ( y > 0 )        addPathToNodeAVL( minDistRec, imgIdx-width, yEdgeCosts[imgIdx-width], numDistMaxs, maxs, &queue );
        if ( y < height-1 ) addPathToNodeAVL( minDistRec, imgIdx+width,       yEdgeCosts[imgIdx], numDistMaxs, maxs, &queue );

    }


    double retVal = 0.0;
    retVal = dists[abs(dstPix)];

    if ( maxVector != NULL ) 
    {
        MaxRec* m = maxs[abs(dstPix)];
        double minSum = m->sumVals;
        for(int i = 0; i < m->numVals; i++) maxVector[i] = m->vals[i];

        while(m->next != NULL)
        {
            m = (MaxRec*) m->next;
            if(m->sumVals < minSum)
            {
                minSum = m->sumVals;
                for(int i = 0; i < m->numVals; i++) maxVector[i] = m->vals[i];
            }
        }
    }

    if ( backPtrs != NULL ) 
    {
        int backIdx = 0;
        MaxRec* backRec = &prevPtrs[abs(dstPix)];
        while(backRec != NULL)
        {
            backPtrs[backIdx++] = backRec->imgIdx;
            backRec = (MaxRec*) backRec->back;
        }
        backPtrs[backIdx++] = -1;
    }
    
    while ( queue != NULL ) avlFindAndDeleteMin( &queue );
    
    #ifdef DEBUG_MODE
    meanNumRecs = (double)numMaxRecs/(double)(width*height);
    maxNumRecsInNode = numMaxRecsInOneNode;
    printf("meanNumRecs: %.2lf\n", meanNumRecs);
    printf("maxNumRecsInNode: %d\n", maxNumRecsInNode);
    #endif

    for ( int i = 0; i < width*height; ++i ) freeMaxRecs( maxs[i] );
    free( maxs ); 
    free( queue );
    free( prevPtrs );
    //if ( distsExt == NULL ) free( dists );

    return retVal;

}